

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O1

void __thiscall DSpotState::DSpotState(DSpotState *this)

{
  TObjPtr<DSpotState> TVar1;
  
  DThinker::DThinker(&this->super_DThinker,0);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070bfe8;
  (this->SpotLists).Array = (FSpotList *)0x0;
  (this->SpotLists).Most = 0;
  (this->SpotLists).Count = 0;
  TVar1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DSpotState>_1)this;
  if ((SpotState.field_0 != (DSpotState *)0x0) &&
     (TVar1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DSpotState>_1)this,
     (*(byte *)((long)SpotState.field_0 + 0x20) & 0x20) == 0)) {
    I_Error("Only one SpotState is allowed to exist at a time.\nCheck your code.");
    TVar1 = SpotState;
  }
  SpotState.field_0 = TVar1.field_0;
  return;
}

Assistant:

DSpotState::DSpotState ()
: DThinker (STAT_INFO)
{
	if (SpotState)
	{
		I_Error ("Only one SpotState is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		SpotState = this;
	}
}